

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprp_restr(lys_ypr_ctx_conflict *pctx,lysp_restr *restr,ly_stmt stmt,char *attr,int8_t *flag)

{
  ly_out *out;
  lysp_restr *pctx_00;
  char *pcVar1;
  char *local_60;
  uint local_44;
  int8_t local_31;
  int8_t *piStack_30;
  int8_t inner_flag;
  int8_t *flag_local;
  char *attr_local;
  lysp_restr *plStack_18;
  ly_stmt stmt_local;
  lysp_restr *restr_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_31 = '\0';
  if (restr != (lysp_restr *)0x0) {
    out = (pctx->field_0).field_0.out;
    if (((pctx->field_0).field_0.options & 2) == 0) {
      local_44 = (uint)(pctx->field_0).field_0.level << 1;
    }
    else {
      local_44 = 0;
    }
    piStack_30 = flag;
    flag_local = attr;
    attr_local._4_4_ = stmt;
    plStack_18 = restr;
    restr_local = (lysp_restr *)pctx;
    pcVar1 = lyplg_ext_stmt2str(stmt);
    ly_print_(out,"%*s<%s %s=\"",(ulong)local_44,"",pcVar1,flag_local);
    if ((*(plStack_18->arg).str == '\x15') || (*(plStack_18->arg).str == '\x06')) {
      local_60 = (plStack_18->arg).str + 1;
    }
    else {
      local_60 = (plStack_18->arg).str;
    }
    lyxml_dump_text((ly_out *)(restr_local->arg).str,local_60,'\x01');
    ly_print_((ly_out *)(restr_local->arg).str,"\"");
    *(short *)&(restr_local->arg).mod = *(short *)&(restr_local->arg).mod + 1;
    yprp_extension_instances
              ((lys_ypr_ctx_conflict *)restr_local,attr_local._4_4_,'\0',plStack_18->exts,&local_31)
    ;
    if (*(plStack_18->arg).str == '\x15') {
      ypr_close_parent((lys_ypr_ctx_conflict *)restr_local,&local_31);
      ypr_substmt((lys_ypr_ctx_conflict *)restr_local,LY_STMT_MODIFIER,'\0',"invert-match",
                  plStack_18->exts);
    }
    if (plStack_18->emsg != (char *)0x0) {
      ypr_close_parent((lys_ypr_ctx_conflict *)restr_local,&local_31);
      ypr_substmt((lys_ypr_ctx_conflict *)restr_local,LY_STMT_ERROR_MESSAGE,'\0',plStack_18->emsg,
                  plStack_18->exts);
    }
    if (plStack_18->eapptag != (char *)0x0) {
      ypr_close_parent((lys_ypr_ctx_conflict *)restr_local,&local_31);
      ypr_substmt((lys_ypr_ctx_conflict *)restr_local,LY_STMT_ERROR_APP_TAG,'\0',plStack_18->eapptag
                  ,plStack_18->exts);
    }
    ypr_description((lys_ypr_ctx_conflict *)restr_local,plStack_18->dsc,plStack_18->exts,&local_31);
    ypr_reference((lys_ypr_ctx_conflict *)restr_local,plStack_18->ref,plStack_18->exts,&local_31);
    pctx_00 = restr_local;
    *(short *)&(restr_local->arg).mod = *(short *)&(restr_local->arg).mod + -1;
    pcVar1 = lyplg_ext_stmt2str(attr_local._4_4_);
    ypr_close((lys_ypr_ctx_conflict *)pctx_00,pcVar1,local_31);
  }
  return;
}

Assistant:

static void
yprp_restr(struct lys_ypr_ctx *pctx, const struct lysp_restr *restr, enum ly_stmt stmt, ly_bool *flag)
{
    ly_bool inner_flag = 0;
    const char *text;
    uint16_t flags = 0;

    if (!restr) {
        return;
    }

    ypr_open(pctx->out, flag);
    text = ((restr->arg.str[0] != LYSP_RESTR_PATTERN_NACK) && (restr->arg.str[0] != LYSP_RESTR_PATTERN_ACK)) ?
            restr->arg.str : restr->arg.str + 1;
    if (!strchr(text, '\n')) {
        flags |= LYS_YPR_TEXT_SINGLELINE;
    }
    if (restr->arg.flags & LYS_SINGLEQUOTED) {
        flags |= LYS_YPR_TEXT_SINGLEQUOTED;
    }
    ypr_text(pctx, lyplg_ext_stmt2str(stmt), text, flags);

    LEVEL++;
    yprp_extension_instances(pctx, stmt, 0, restr->exts, &inner_flag);
    if (restr->arg.str[0] == LYSP_RESTR_PATTERN_NACK) {
        /* special byte value in pattern's expression: 0x15 - invert-match, 0x06 - match */
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_MODIFIER, 0, "invert-match", 0, restr->exts);
    }
    if (restr->emsg) {
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_ERROR_MESSAGE, 0, restr->emsg, 0, restr->exts);
    }
    if (restr->eapptag) {
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_ERROR_APP_TAG, 0, restr->eapptag, 0, restr->exts);
    }
    ypr_description(pctx, restr->dsc, restr->exts, &inner_flag);
    ypr_reference(pctx, restr->ref, restr->exts, &inner_flag);

    LEVEL--;
    ypr_close(pctx, inner_flag);
}